

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robotKuka.cpp
# Opt level: O0

void __thiscall RobotKuka::RobotKuka(RobotKuka *this,float CYCLE_TIME)

{
  float CYCLE_TIME_local;
  RobotKuka *this_local;
  
  std::queue<Pose,std::deque<Pose,std::allocator<Pose>>>::
  queue<std::deque<Pose,std::allocator<Pose>>,void>
            ((queue<Pose,std::deque<Pose,std::allocator<Pose>>> *)&this->move_queue);
  Pose::Pose(&this->security_limit_speed,100.0,100.0,100.0,60.0,60.0,60.0);
  this->CYCLE_TIME = CYCLE_TIME;
  return;
}

Assistant:

RobotKuka::RobotKuka(float CYCLE_TIME)
{
	this->CYCLE_TIME = CYCLE_TIME;
}